

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

GraphId __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::GetId(GraphCycles *this,void *ptr)

{
  uint32_t uVar1;
  Rep *pRVar2;
  Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*> *pVVar3;
  Node **ppNVar4;
  void *pvVar5;
  GraphId GVar6;
  Node *pNVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  
  pRVar2 = this->rep_;
  uVar12 = (ulong)ptr % 0x3fffb;
  uVar8 = (pRVar2->ptrmap_).table_._M_elems[uVar12];
  pVVar3 = (pRVar2->ptrmap_).nodes_;
  pvVar10 = ptr;
  do {
    if (uVar8 == 0xffffffff) {
      uVar9 = 0xffffffff;
      break;
    }
    pNVar7 = pVVar3->ptr_[uVar8];
    uVar11 = pNVar7->masked_ptr ^ (ulong)ptr;
    pvVar5 = (void *)(ulong)uVar8;
    if (uVar11 != 0xf03a5f7bf03a5f7b) {
      uVar8 = pNVar7->next_hash;
      pvVar5 = (void *)((ulong)pvVar10 & 0xffffffff);
    }
    pvVar10 = pvVar5;
    uVar9 = (uint)pvVar10;
  } while (uVar11 != 0xf03a5f7bf03a5f7b);
  if (uVar9 == 0xffffffff) {
    uVar1 = (pRVar2->free_nodes_).size_;
    if (uVar1 == 0) {
      pNVar7 = (Node *)base_internal::LowLevelAlloc::AllocWithArena
                                 (0x1d0,synchronization_internal::(anonymous_namespace)::arena);
      anon_unknown_0::NodeSet::NodeSet(&pNVar7->in);
      anon_unknown_0::NodeSet::NodeSet(&pNVar7->out);
      pNVar7->version = 1;
      pNVar7->visited = false;
      pRVar2 = this->rep_;
      uVar1 = (pRVar2->nodes_).size_;
      pNVar7->rank = uVar1;
      pNVar7->masked_ptr = (ulong)ptr ^ 0xf03a5f7bf03a5f7b;
      pNVar7->priority = 0;
      pNVar7->nstack = 0;
      if (uVar1 == (pRVar2->nodes_).capacity_) {
        anon_unknown_0::
        Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::Grow
                  (&pRVar2->nodes_,uVar1 + 1);
      }
      uVar8 = (pRVar2->nodes_).size_;
      (pRVar2->nodes_).ptr_[uVar8] = pNVar7;
      (pRVar2->nodes_).size_ = uVar8 + 1;
      pRVar2 = this->rep_;
      uVar8 = pNVar7->rank;
      ((pRVar2->ptrmap_).nodes_)->ptr_[uVar8]->next_hash = (pRVar2->ptrmap_).table_._M_elems[uVar12]
      ;
      (pRVar2->ptrmap_).table_._M_elems[uVar12] = uVar8;
      GVar6.handle._0_4_ = pNVar7->rank;
      GVar6.handle._4_4_ = pNVar7->version;
    }
    else {
      ppNVar4 = (pRVar2->nodes_).ptr_;
      uVar9 = uVar1 - 1;
      uVar8 = (pRVar2->free_nodes_).ptr_[uVar9];
      (pRVar2->free_nodes_).size_ = uVar9;
      pNVar7 = ppNVar4[uVar8];
      pNVar7->masked_ptr = (ulong)ptr ^ 0xf03a5f7bf03a5f7b;
      pNVar7->priority = 0;
      pNVar7->nstack = 0;
      pVVar3->ptr_[uVar8]->next_hash = (pRVar2->ptrmap_).table_._M_elems[uVar12];
      (pRVar2->ptrmap_).table_._M_elems[uVar12] = uVar8;
      GVar6.handle = CONCAT44(pNVar7->version,uVar8);
    }
  }
  else {
    GVar6.handle = CONCAT44((pRVar2->nodes_).ptr_[uVar9]->version,uVar9);
  }
  return (GraphId)GVar6.handle;
}

Assistant:

GraphId GraphCycles::GetId(void* ptr) {
  int32_t i = rep_->ptrmap_.Find(ptr);
  if (i != -1) {
    return MakeId(i, rep_->nodes_[static_cast<uint32_t>(i)]->version);
  } else if (rep_->free_nodes_.empty()) {
    Node* n =
        new (base_internal::LowLevelAlloc::AllocWithArena(sizeof(Node), arena))
            Node;
    n->version = 1;  // Avoid 0 since it is used by InvalidGraphId()
    n->visited = false;
    n->rank = static_cast<int32_t>(rep_->nodes_.size());
    n->masked_ptr = base_internal::HidePtr(ptr);
    n->nstack = 0;
    n->priority = 0;
    rep_->nodes_.push_back(n);
    rep_->ptrmap_.Add(ptr, n->rank);
    return MakeId(n->rank, n->version);
  } else {
    // Preserve preceding rank since the set of ranks in use must be
    // a permutation of [0,rep_->nodes_.size()-1].
    int32_t r = rep_->free_nodes_.back();
    rep_->free_nodes_.pop_back();
    Node* n = rep_->nodes_[static_cast<uint32_t>(r)];
    n->masked_ptr = base_internal::HidePtr(ptr);
    n->nstack = 0;
    n->priority = 0;
    rep_->ptrmap_.Add(ptr, r);
    return MakeId(r, n->version);
  }
}